

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrestreply.cpp
# Opt level: O3

void __thiscall QRestReply::~QRestReply(QRestReply *this)

{
  QRestReplyPrivate *pQVar1;
  Data *pDVar2;
  
  pQVar1 = this->d;
  if ((pQVar1 != (QRestReplyPrivate *)0x0) &&
     ((pQVar1->decoder).super__Optional_base<QStringDecoder,_false,_false>._M_payload.
      super__Optional_payload<QStringDecoder,_true,_false,_false>.
      super__Optional_payload_base<QStringDecoder>._M_engaged == true)) {
    (pQVar1->decoder).super__Optional_base<QStringDecoder,_false,_false>._M_payload.
    super__Optional_payload<QStringDecoder,_true,_false,_false>.
    super__Optional_payload_base<QStringDecoder>._M_engaged = false;
    QStringConverterBase::State::clear();
  }
  operator_delete(pQVar1,0x40);
  pDVar2 = (this->wrapped).wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar2 = (this->wrapped).wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
      return;
    }
  }
  return;
}

Assistant:

QRestReply::~QRestReply()
{
    delete d;
}